

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iunk.c
# Opt level: O1

int envy_bios_parse_iunk21(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  envy_bios_iunk21_entry *peVar6;
  uint16_t uVar7;
  int iVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  char *__format;
  int iVar14;
  
  uVar2 = (bios->iunk21).offset;
  iVar3 = 0;
  if (uVar2 != 0) {
    if ((uint)uVar2 < bios->length) {
      (bios->iunk21).version = bios->data[(uint)uVar2];
      iVar14 = 0;
    }
    else {
      (bios->iunk21).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar14 = -0xe;
    }
    lVar10 = (ulong)(bios->iunk21).offset + 1;
    if ((uint)lVar10 < bios->length) {
      (bios->iunk21).hlen = bios->data[lVar10];
      iVar13 = 0;
    }
    else {
      (bios->iunk21).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar13 = -0xe;
    }
    lVar10 = (ulong)(bios->iunk21).offset + 2;
    if ((uint)lVar10 < bios->length) {
      (bios->iunk21).rlen = bios->data[lVar10];
      iVar4 = 0;
    }
    else {
      (bios->iunk21).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar4 = -0xe;
    }
    lVar10 = (ulong)(bios->iunk21).offset + 3;
    if ((uint)lVar10 < bios->length) {
      (bios->iunk21).entriesnum = bios->data[lVar10];
      iVar8 = 0;
    }
    else {
      (bios->iunk21).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar8 = -0xe;
    }
    iVar3 = -0xe;
    if (((iVar13 == 0 && iVar14 == 0) && iVar4 == 0) && iVar8 == 0) {
      envy_bios_block(bios,(uint)(bios->iunk21).offset,
                      (uint)(bios->iunk21).entriesnum * (uint)(bios->iunk21).rlen +
                      (uint)(bios->iunk21).hlen,"IUNK21",-1);
      if ((bios->iunk21).version == '\x10') {
        bVar1 = (bios->iunk21).hlen;
        uVar11 = (ulong)bVar1;
        if (bVar1 < 4) {
          __format = "IUNK21 table header too short [%d < %d]\n";
          uVar9 = 4;
        }
        else {
          uVar5 = (uint)(bios->iunk21).rlen;
          if (2 < uVar5) {
            if (bVar1 != 4) {
              fprintf(_stderr,"IUNK21 table header longer than expected [%d > %d]\n",uVar11,4);
            }
            bVar1 = (bios->iunk21).rlen;
            if (3 < bVar1) {
              fprintf(_stderr,"IUNK21 table record longer than expected [%d > %d]\n",(ulong)bVar1,3)
              ;
            }
            uVar11 = (ulong)(bios->iunk21).entriesnum;
            peVar6 = (envy_bios_iunk21_entry *)calloc(uVar11,8);
            (bios->iunk21).entries = peVar6;
            if (peVar6 != (envy_bios_iunk21_entry *)0x0) {
              if (uVar11 != 0) {
                bVar1 = (bios->iunk21).rlen;
                uVar7 = (ushort)(bios->iunk21).hlen + (bios->iunk21).offset;
                uVar12 = 0;
                do {
                  peVar6[uVar12].offset = uVar7;
                  uVar7 = uVar7 + bVar1;
                  uVar12 = uVar12 + 1;
                } while (uVar11 != uVar12);
              }
              (bios->iunk21).valid = '\x01';
              return 0;
            }
            return -0xc;
          }
          __format = "IUNK21 table record too short [%d < %d]\n";
          uVar11 = (ulong)uVar5;
          uVar9 = 3;
        }
        fprintf(_stderr,__format,uVar11,uVar9);
      }
      else {
        envy_bios_parse_iunk21_cold_1();
      }
      iVar3 = -0x16;
    }
  }
  return iVar3;
}

Assistant:

int envy_bios_parse_iunk21 (struct envy_bios *bios) {
	struct envy_bios_iunk21 *iunk21 = &bios->iunk21;
	if (!iunk21->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, iunk21->offset, &iunk21->version);
	err |= bios_u8(bios, iunk21->offset+1, &iunk21->hlen);
	err |= bios_u8(bios, iunk21->offset+2, &iunk21->rlen);
	err |= bios_u8(bios, iunk21->offset+3, &iunk21->entriesnum);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, iunk21->offset, iunk21->hlen + iunk21->rlen * iunk21->entriesnum, "IUNK21", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (iunk21->version) {
		case 0x10:
			wanthlen = 4;
			wantrlen = 3;
			break;
		default:
			ENVY_BIOS_ERR("Unknown IUNK21 table version %d.%d\n", iunk21->version >> 4, iunk21->version & 0xf);
			return -EINVAL;
	}
	if (iunk21->hlen < wanthlen) {
		ENVY_BIOS_ERR("IUNK21 table header too short [%d < %d]\n", iunk21->hlen, wanthlen);
		return -EINVAL;
	}
	if (iunk21->rlen < wantrlen) {
		ENVY_BIOS_ERR("IUNK21 table record too short [%d < %d]\n", iunk21->rlen, wantrlen);
		return -EINVAL;
	}
	if (iunk21->hlen > wanthlen) {
		ENVY_BIOS_WARN("IUNK21 table header longer than expected [%d > %d]\n", iunk21->hlen, wanthlen);
	}
	if (iunk21->rlen > wantrlen) {
		ENVY_BIOS_WARN("IUNK21 table record longer than expected [%d > %d]\n", iunk21->rlen, wantrlen);
	}
	iunk21->entries = calloc(iunk21->entriesnum, sizeof *iunk21->entries);
	if (!iunk21->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < iunk21->entriesnum; i++) {
		struct envy_bios_iunk21_entry *entry = &iunk21->entries[i];
		entry->offset = iunk21->offset + iunk21->hlen + iunk21->rlen * i;
		/* XXX */
		if (err)
			return -EFAULT;
	}
	iunk21->valid = 1;
	return 0;
}